

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<Symbol>::moveAppend(QGenericArrayOps<Symbol> *this,Symbol *b,Symbol *e)

{
  qsizetype *pqVar1;
  Symbol *pSVar2;
  
  if (b != e) {
    pSVar2 = (this->super_QArrayDataPointer<Symbol>).ptr;
    for (; b < e; b = b + 1) {
      Symbol::Symbol(pSVar2 + (this->super_QArrayDataPointer<Symbol>).size,b);
      pqVar1 = &(this->super_QArrayDataPointer<Symbol>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }